

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationY.hpp
# Opt level: O1

void __thiscall
qclab::qgates::RotationY<std::complex<float>_>::RotationY
          (RotationY<std::complex<float>_> *this,real_type theta)

{
  float fVar1;
  
  (this->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.qubit_ = 0;
  (this->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.field_0xc =
       0;
  (this->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.
  super_QObject<std::complex<float>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_00139e88;
  fVar1 = cosf(theta * 0.5);
  (this->super_QRotationGate1<std::complex<float>_>).rotation_.angle_.cos_ = fVar1;
  fVar1 = sinf(theta * 0.5);
  (this->super_QRotationGate1<std::complex<float>_>).rotation_.angle_.sin_ = fVar1;
  (this->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.
  super_QObject<std::complex<float>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_00139f10;
  return;
}

Assistant:

RotationY( const real_type theta )
        : QRotationGate1< T >( 0 , theta )
        { }